

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O2

void gpc_cb16(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  uVar3 = in->a;
  if ((int)uVar3 < 1) {
    iVar1 = back->ig;
    out->r = back->ir;
    out->g = iVar1;
    uVar3 = back->ib;
  }
  else {
    if (uVar3 < 0xffff) {
      dVar5 = 1.0 - (double)(int)uVar3 / 65535.0;
      dVar4 = ((double)(int)uVar3 / 65535.0) / 65535.0;
      bVar2 = sRGB((double)in->r * dVar4 + back->dr * dVar5);
      out->r = (uint)bVar2;
      bVar2 = sRGB((double)in->g * dVar4 + back->dg * dVar5);
      out->g = (uint)bVar2;
      bVar2 = sRGB((double)in->b * dVar4 + dVar5 * back->db);
    }
    else {
      bVar2 = isRGB(in->r);
      out->r = (uint)bVar2;
      bVar2 = isRGB(in->g);
      out->g = (uint)bVar2;
      bVar2 = isRGB(in->b);
    }
    uVar3 = (uint)bVar2;
  }
  out->b = uVar3;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_cb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
   {
      out->r = back->ir;
      out->g = back->ig;
      out->b = back->ib;
   }

   else if (in->a >= 65535)
   {
      out->r = isRGB(in->r);
      out->g = isRGB(in->g);
      out->b = isRGB(in->b);
   }

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = sRGB(in->r * a + back->dr * a1);
      out->g = sRGB(in->g * a + back->dg * a1);
      out->b = sRGB(in->b * a + back->db * a1);
   }

   out->a = 255;
}